

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utilSort.c
# Opt level: O1

void Abc_MergeSortCost_rec(int *pInBeg,int *pInEnd,int *pOutBeg)

{
  ulong uVar1;
  int *pInEnd_00;
  int iVar2;
  int iVar3;
  ulong uVar4;
  ulong uVar5;
  ulong uVar6;
  ulong uVar7;
  ulong uVar8;
  uint uVar9;
  
  uVar9 = (uint)(((long)pInEnd - (long)pInBeg >> 2) - ((long)pInEnd - (long)pInBeg >> 0x3f) >> 1);
  if ((int)uVar9 < 1) {
    __assert_fail("nSize > 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/util/utilSort.c"
                  ,0xba,"void Abc_MergeSortCost_rec(int *, int *, int *)");
  }
  if (uVar9 != 1) {
    if (uVar9 == 2) {
      iVar2 = pInBeg[3];
      if (iVar2 < pInBeg[1]) {
        pInBeg[3] = pInBeg[1];
        pInBeg[1] = iVar2;
        iVar2 = pInBeg[2];
        pInBeg[2] = *pInBeg;
        *pInBeg = iVar2;
      }
    }
    else {
      if (7 < (int)uVar9) {
        pInEnd_00 = pInBeg + (uVar9 & 0x7ffffffe);
        Abc_MergeSortCost_rec(pInBeg,pInEnd_00,pOutBeg);
        Abc_MergeSortCost_rec(pInEnd_00,pInEnd,pOutBeg + (uVar9 & 0x7ffffffe));
        Abc_MergeSortCostMerge(pInBeg,pInEnd_00,pInEnd_00,pInEnd,pOutBeg);
        memcpy(pInBeg,pOutBeg,(ulong)(uVar9 & 0x7fffffff) << 3);
        return;
      }
      if (uVar9 != 1) {
        uVar4 = 1;
        uVar5 = 0;
        do {
          uVar1 = uVar5 + 1;
          uVar6 = uVar4;
          uVar8 = uVar5 & 0xffffffff;
          do {
            uVar7 = uVar6 & 0xffffffff;
            if (pInBeg[(int)uVar8 * 2 + 1] <= pInBeg[uVar6 * 2 + 1]) {
              uVar7 = uVar8;
            }
            uVar6 = uVar6 + 1;
            uVar8 = uVar7;
          } while ((uVar9 & 0x7fffffff) != uVar6);
          iVar2 = pInBeg[uVar5 * 2];
          iVar3 = (int)uVar7 * 2;
          pInBeg[uVar5 * 2] = pInBeg[iVar3];
          pInBeg[iVar3] = iVar2;
          iVar2 = pInBeg[uVar5 * 2 + 1];
          iVar3 = (int)uVar7 * 2 + 1;
          pInBeg[uVar5 * 2 + 1] = pInBeg[iVar3];
          pInBeg[iVar3] = iVar2;
          uVar4 = uVar4 + 1;
          uVar5 = uVar1;
        } while (uVar1 != uVar9 - 1);
      }
    }
  }
  return;
}

Assistant:

void Abc_MergeSortCost_rec( int * pInBeg, int * pInEnd, int * pOutBeg )
{
    int nSize = (pInEnd - pInBeg)/2;
    assert( nSize > 0 );
    if ( nSize == 1 )
        return;
    if ( nSize == 2 )
    {
         if ( pInBeg[1] > pInBeg[3] )
         {
             pInBeg[1] ^= pInBeg[3];
             pInBeg[3] ^= pInBeg[1];
             pInBeg[1] ^= pInBeg[3];
             pInBeg[0] ^= pInBeg[2];
             pInBeg[2] ^= pInBeg[0];
             pInBeg[0] ^= pInBeg[2];
         }
    }
    else if ( nSize < 8 )
    {
        int temp, i, j, best_i;
        for ( i = 0; i < nSize-1; i++ )
        {
            best_i = i;
            for ( j = i+1; j < nSize; j++ )
                if ( pInBeg[2*j+1] < pInBeg[2*best_i+1] )
                    best_i = j;
            temp = pInBeg[2*i]; 
            pInBeg[2*i] = pInBeg[2*best_i]; 
            pInBeg[2*best_i] = temp;
            temp = pInBeg[2*i+1]; 
            pInBeg[2*i+1] = pInBeg[2*best_i+1]; 
            pInBeg[2*best_i+1] = temp;
        }
    }
    else
    {
        Abc_MergeSortCost_rec( pInBeg, pInBeg + 2*(nSize/2), pOutBeg );
        Abc_MergeSortCost_rec( pInBeg + 2*(nSize/2), pInEnd, pOutBeg + 2*(nSize/2) );
        Abc_MergeSortCostMerge( pInBeg, pInBeg + 2*(nSize/2), pInBeg + 2*(nSize/2), pInEnd, pOutBeg );
        memcpy( pInBeg, pOutBeg, sizeof(int) * 2 * nSize );
    }
}